

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationVerificationDeclarationDeclaredCompile_Test::
CommandLineInterfaceTest_ExtensionDeclarationVerificationDeclarationDeclaredCompile_Test
          (CommandLineInterfaceTest_ExtensionDeclarationVerificationDeclarationDeclaredCompile_Test
           *this)

{
  CommandLineInterfaceTest_ExtensionDeclarationVerificationDeclarationDeclaredCompile_Test
  *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)
       &
       PTR__CommandLineInterfaceTest_ExtensionDeclarationVerificationDeclarationDeclaredCompile_Test_029fe9d0
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       ExtensionDeclarationVerificationDeclarationDeclaredCompile) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [
        verification = DECLARATION,
        declaration = {
          number: 5000,
          full_name: ".foo.my_field",
          type: "string"
      }];
    }
    extend Foo {
      optional string my_field = 5000;
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
}